

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O1

bool __thiscall cfd::Psbt::HasAllUtxos(Psbt *this)

{
  void *pvVar1;
  long lVar2;
  CfdException *pCVar3;
  long *plVar4;
  long lVar5;
  undefined1 local_40 [32];
  
  pvVar1 = (this->super_Psbt).wally_psbt_pointer_;
  if (pvVar1 == (void *)0x0) {
    local_40._0_8_ = "cfd_psbt.cpp";
    local_40._8_4_ = 0xef;
    local_40._16_8_ = "HasAllUtxos";
    core::logger::log<>((CfdSourceLocation *)local_40,kCfdLogLevelWarning,"psbt pointer is null");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_40._0_8_ = local_40 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"psbt pointer is null.","");
    core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)local_40);
    __cxa_throw(pCVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (*(long *)((long)pvVar1 + 8) != 0) {
    lVar2 = *(long *)((long)pvVar1 + 0x18);
    if (lVar2 != 0) {
      plVar4 = (long *)(*(long *)((long)pvVar1 + 0x10) + 8);
      lVar5 = lVar2;
      do {
        if ((*plVar4 == 0) && (plVar4[-1] == 0)) {
          return false;
        }
        plVar4 = plVar4 + 0x22;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    return lVar2 != 0;
  }
  local_40._0_8_ = "cfd_psbt.cpp";
  local_40._8_4_ = 0xf3;
  local_40._16_8_ = "HasAllUtxos";
  core::logger::log<>((CfdSourceLocation *)local_40,kCfdLogLevelWarning,"psbt base tx is null");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._0_8_ = local_40 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"psbt base tx is null.","");
  core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)local_40);
  __cxa_throw(pCVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

bool Psbt::HasAllUtxos() const {
  struct wally_psbt* psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt*>(wally_psbt_pointer_);
  if (psbt_pointer == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt pointer is null");
    throw CfdException(
        CfdError::kCfdIllegalStateError, "psbt pointer is null.");
  } else if (psbt_pointer->tx == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt base tx is null");
    throw CfdException(
        CfdError::kCfdIllegalStateError, "psbt base tx is null.");
  }

  for (size_t index = 0; index < psbt_pointer->num_inputs; ++index) {
    if ((psbt_pointer->inputs[index].witness_utxo == nullptr) &&
        (psbt_pointer->inputs[index].utxo == nullptr)) {
      return false;
    }
  }
  return (psbt_pointer->num_inputs != 0);
}